

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::bandSolve(Matrix *this,Matrix *A,Matrix *b,int k)

{
  int iVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  double **ppdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double **ppdVar9;
  bool bVar10;
  ulong uVar11;
  domain_error *this_00;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  double **ppdVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  Matrix MVar23;
  
  iVar1 = A->rows_;
  uVar11 = (ulong)iVar1;
  if (0 < (long)uVar11) {
    ppdVar3 = A->p;
    uVar20 = 1;
    uVar16 = 0;
    do {
      pdVar4 = ppdVar3[uVar16];
      if ((pdVar4[uVar16] == 0.0) && (!NAN(pdVar4[uVar16]))) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again."
                  );
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      uVar17 = uVar16 + 1;
      if (uVar17 < uVar11 && 2 < k) {
        uVar2 = A->cols_;
        ppdVar5 = b->p;
        pdVar6 = ppdVar5[uVar16];
        uVar15 = uVar20;
        do {
          if ((long)uVar17 < (long)(int)uVar2) {
            pdVar7 = ppdVar3[uVar15];
            uVar14 = uVar20;
            do {
              dVar22 = pdVar7[uVar14];
              if ((dVar22 == 0.0) && (!NAN(dVar22))) break;
              pdVar7[uVar14] = dVar22 - (pdVar7[uVar16] / pdVar4[uVar16]) * pdVar4[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar2 != uVar14);
          }
          pdVar7 = ppdVar3[uVar15];
          pdVar8 = ppdVar5[uVar15];
          *pdVar8 = *pdVar8 - (pdVar7[uVar16] / pdVar4[uVar16]) * *pdVar6;
          pdVar7[uVar16] = 0.0;
        } while (((int)(uVar15 + 1) < iVar1) &&
                (bVar10 = (long)uVar15 < (long)(uVar16 + (long)((k - (k + -1 >> 0x1f)) + -1 >> 1)),
                uVar15 = uVar15 + 1, bVar10));
      }
      uVar20 = uVar20 + 1;
      uVar16 = uVar17;
    } while (uVar17 != uVar11);
  }
  Matrix(this,b->rows_,1);
  ppdVar3 = b->p;
  iVar1 = this->rows_;
  lVar12 = (long)iVar1;
  ppdVar5 = A->p;
  ppdVar9 = this->p;
  *ppdVar9[lVar12 + -1] = *ppdVar3[lVar12 + -1] / ppdVar5[lVar12 + -1][lVar12 + -1];
  if (1 < lVar12) {
    uVar16 = (ulong)(iVar1 - 1);
    lVar18 = uVar16 * 8;
    ppdVar19 = ppdVar9 + uVar16;
    uVar11 = (ulong)(iVar1 - 2);
    do {
      dVar22 = 0.0;
      if ((long)uVar11 < lVar12 + -1) {
        lVar21 = 0;
        iVar13 = 0;
        do {
          iVar13 = (int)(*(double *)((long)ppdVar5[uVar11] + lVar21 * 8 + lVar18) *
                         *ppdVar19[lVar21] + (double)iVar13);
          lVar21 = lVar21 + 1;
        } while ((int)lVar21 + (int)uVar16 < iVar1);
        dVar22 = (double)iVar13;
      }
      *ppdVar9[uVar11] = (*ppdVar3[uVar11] - dVar22) / ppdVar5[uVar11][uVar11];
      uVar16 = uVar16 - 1;
      ppdVar19 = ppdVar19 + -1;
      lVar18 = lVar18 + -8;
      bVar10 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar10);
  }
  MVar23.p = ppdVar5;
  MVar23._0_8_ = this;
  return MVar23;
}

Assistant:

Matrix Matrix::bandSolve(Matrix A, Matrix b, int k)
{
    // optimized Gaussian elimination
    int bandsBelow = (k - 1) / 2;
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw exception
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_ && j <= i + bandsBelow; ++j) {
            int k = i + 1;
            while (k < A.cols_ && A.p[j][k]) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                k++;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
    }

    return x;
}